

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,size_t escapeOffset
          )

{
  MemoryStream *pMVar1;
  Ch *pCVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Ch *pCVar6;
  int iVar7;
  Ch CVar8;
  
  pMVar1 = is->is_;
  pCVar6 = pMVar1->src_;
  pCVar2 = pMVar1->end_;
  uVar4 = 0;
  iVar7 = 4;
  while( true ) {
    if (pCVar6 == pCVar2) {
      CVar8 = '\0';
    }
    else {
      CVar8 = *pCVar6;
    }
    uVar4 = uVar4 * 0x10 + (int)CVar8;
    iVar5 = -0x30;
    if ((((byte)(CVar8 - 0x30U) < 10) || (iVar5 = -0x37, (byte)(CVar8 + 0xbfU) < 6)) ||
       (iVar5 = -0x57, (byte)(CVar8 + 0x9fU) < 6)) {
      uVar4 = uVar4 + iVar5;
      bVar3 = true;
      if (pCVar6 != pCVar2) {
        pCVar6 = pCVar6 + 1;
        pMVar1->src_ = pCVar6;
      }
    }
    else {
      *(undefined4 *)(this + 0x30) = 8;
      *(size_t *)(this + 0x38) = escapeOffset;
      bVar3 = false;
    }
    if (!bVar3) break;
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      return uVar4;
    }
  }
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }